

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void cdef_mse_calc_frame(CdefSearchCtx *cdef_search_ctx,aom_internal_error_info *error_info)

{
  int iVar1;
  undefined8 in_RSI;
  CommonModeInfoParams *in_RDI;
  int fbc;
  int fbr;
  int in_stack_0000afcc;
  int in_stack_0000afd0;
  int in_stack_0000afd4;
  aom_internal_error_info *in_stack_0000afd8;
  CdefSearchCtx *in_stack_0000afe0;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)&in_RDI[0x52].tx_type_map; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < *(int *)((long)&in_RDI[0x52].tx_type_map + 4);
        local_18 = local_18 + 1) {
      iVar1 = cdef_sb_skip(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      if (iVar1 == 0) {
        av1_cdef_mse_calc_block
                  (in_stack_0000afe0,in_stack_0000afd8,in_stack_0000afd4,in_stack_0000afd0,
                   in_stack_0000afcc);
        in_RDI[0x53].mb_rows = in_RDI[0x53].mb_rows + 1;
      }
    }
  }
  return;
}

Assistant:

static void cdef_mse_calc_frame(CdefSearchCtx *cdef_search_ctx,
                                struct aom_internal_error_info *error_info) {
  // Loop over each sb.
  for (int fbr = 0; fbr < cdef_search_ctx->nvfb; ++fbr) {
    for (int fbc = 0; fbc < cdef_search_ctx->nhfb; ++fbc) {
      // Checks if cdef processing can be skipped for particular sb.
      if (cdef_sb_skip(cdef_search_ctx->mi_params, fbr, fbc)) continue;
      // Calculate mse for each sb and store the relevant sb index.
      av1_cdef_mse_calc_block(cdef_search_ctx, error_info, fbr, fbc,
                              cdef_search_ctx->sb_count);
      cdef_search_ctx->sb_count++;
    }
  }
}